

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bingo.hpp
# Opt level: O2

void __thiscall BingoGenerator::init_consumable_goals(BingoGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int __val;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->_consumable_goals;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[14]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [14])"Have 9 EkeEke");
  for (__val = 6; __val != 10; __val = __val + 1) {
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_70,"Have ",&local_90);
    std::operator+(&local_50,&local_70," Detox Grass");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_70,"Have ",&local_90);
    std::operator+(&local_50,&local_70," Dahl");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_70,"Have ",&local_90);
    std::operator+(&local_50,&local_70," Anti-Paralyze");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_70,"Have ",&local_90);
    std::operator+(&local_50,&local_70," Restoration");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_70,"Have ",&local_90);
    std::operator+(&local_50,&local_70," Statue of Gaia");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_70,"Have ",&local_90);
    std::operator+(&local_50,&local_70," Golden Statue");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  vectools::shuffle<std::__cxx11::string>(this_00,&this->_rng);
  return;
}

Assistant:

void init_consumable_goals()
    {
        _consumable_goals.emplace_back("Have 9 EkeEke");
        for(int i = 6 ; i <= 9 ; ++i)
        {
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Detox Grass");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Dahl");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Anti-Paralyze");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Restoration");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Statue of Gaia");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Golden Statue");
        }
        vectools::shuffle(_consumable_goals, _rng);
        // Short Cakes ? Pawn Tickets ?
    }